

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O3

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t _elemsize;
  Mat *this_00;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  int *piVar7;
  pointer pMVar8;
  pointer pMVar9;
  uint uVar10;
  pointer pMVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  pointer pMVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = pMVar9->dims;
  _elemsize = pMVar9->elemsize;
  if (uVar10 == 1) {
    lVar15 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar15 == 0) {
      iVar13 = 0;
    }
    else {
      lVar15 = (lVar15 >> 4) * -0x5555555555555555;
      lVar15 = lVar15 + (ulong)(lVar15 == 0);
      piVar7 = &pMVar9->w;
      iVar13 = 0;
      do {
        iVar13 = iVar13 + *piVar7;
        piVar7 = piVar7 + 0xc;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (((pMVar9->dims == 1) && (pMVar9->w == iVar13)) && (pMVar9->elemsize == _elemsize)) {
      pvVar17 = pMVar9->data;
      if (pvVar17 != (void *)0x0) {
        sVar12 = pMVar9->cstep;
LAB_0010a3a6:
        if ((long)pMVar9->c * sVar12 != 0) {
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish != pMVar9) {
            lVar15 = 0;
            uVar18 = 0;
            do {
              lVar14 = (long)*(int *)((long)&pMVar9->w + lVar15);
              memcpy(pvVar17,*(void **)((long)&pMVar9->data + lVar15),_elemsize * lVar14);
              pvVar17 = (void *)((long)pvVar17 + lVar14 * 4);
              uVar18 = uVar18 + 1;
              pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              lVar15 = lVar15 + 0x30;
            } while (uVar18 < (ulong)(((long)(bottom_blobs->
                                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pMVar9 >> 4) * -0x5555555555555555));
          }
          goto LAB_0010aca4;
        }
      }
    }
    else {
      piVar7 = pMVar9->refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if ((*piVar7 == 0) && (pMVar9->data != (void *)0x0)) {
          free(*(void **)((long)pMVar9->data + -8));
        }
      }
      pMVar9->data = (void *)0x0;
      pMVar9->refcount = (int *)0x0;
      pMVar9->elemsize = _elemsize;
      pMVar9->dims = 1;
      pMVar9->w = iVar13;
      pMVar9->h = 1;
      pMVar9->c = 1;
      sVar12 = (size_t)iVar13;
      pMVar9->cstep = sVar12;
      if (iVar13 != 0) {
        lVar15 = _elemsize * sVar12;
        pvVar6 = malloc(lVar15 + 0x1c);
        pvVar17 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar17 + -8) = pvVar6;
        pMVar9->data = pvVar17;
        pMVar9->refcount = (int *)((long)pvVar17 + lVar15);
        *(undefined4 *)((long)pvVar17 + lVar15) = 1;
        goto LAB_0010a3a6;
      }
    }
LAB_0010ab74:
    iVar13 = -100;
  }
  else {
    uVar5 = this->axis;
    if ((uVar10 ^ 2) == 0 && uVar5 == 0) {
      lVar15 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar15 == 0) {
        iVar13 = 0;
      }
      else {
        lVar15 = (lVar15 >> 4) * -0x5555555555555555;
        lVar15 = lVar15 + (ulong)(lVar15 == 0);
        piVar7 = &pMVar9->h;
        iVar13 = 0;
        do {
          iVar13 = iVar13 + *piVar7;
          piVar7 = piVar7 + 0xc;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      iVar3 = pMVar9->w;
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((((pMVar9->dims == 2) && (pMVar9->w == iVar3)) && (pMVar9->h == iVar13)) &&
         (pMVar9->elemsize == _elemsize)) {
        pvVar17 = pMVar9->data;
        if (pvVar17 != (void *)0x0) {
          sVar12 = pMVar9->cstep;
LAB_0010a535:
          if ((long)pMVar9->c * sVar12 != 0) {
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar9) {
              lVar15 = 0x20;
              uVar18 = 0;
              do {
                lVar14 = (long)*(int *)((long)&pMVar9->data + lVar15) * (long)iVar3;
                memcpy(pvVar17,*(void **)((long)pMVar9 + lVar15 + -0x20),_elemsize * lVar14);
                pvVar17 = (void *)((long)pvVar17 + lVar14 * 4);
                uVar18 = uVar18 + 1;
                pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar15 = lVar15 + 0x30;
              } while (uVar18 < (ulong)(((long)(bottom_blobs->
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar9 >> 4) * -0x5555555555555555));
            }
            goto LAB_0010aca4;
          }
        }
      }
      else {
        piVar7 = pMVar9->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if ((*piVar7 == 0) && (pMVar9->data != (void *)0x0)) {
            free(*(void **)((long)pMVar9->data + -8));
          }
        }
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        pMVar9->elemsize = _elemsize;
        pMVar9->dims = 2;
        pMVar9->w = iVar3;
        pMVar9->h = iVar13;
        pMVar9->c = 1;
        sVar12 = (size_t)(iVar13 * iVar3);
        pMVar9->cstep = sVar12;
        if (iVar13 * iVar3 != 0) {
          lVar15 = _elemsize * sVar12;
          pvVar6 = malloc(lVar15 + 0x1c);
          pvVar17 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar17 + -8) = pvVar6;
          pMVar9->data = pvVar17;
          pMVar9->refcount = (int *)((long)pvVar17 + lVar15);
          *(undefined4 *)((long)pvVar17 + lVar15) = 1;
          goto LAB_0010a535;
        }
      }
      goto LAB_0010ab74;
    }
    if ((uVar10 ^ 2) == 0 && (uVar5 ^ 1) == 0) {
      lVar15 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar15 == 0) {
        iVar13 = 0;
      }
      else {
        lVar15 = (lVar15 >> 4) * -0x5555555555555555;
        lVar15 = lVar15 + (ulong)(lVar15 == 0);
        piVar7 = &pMVar9->w;
        iVar13 = 0;
        do {
          iVar13 = iVar13 + *piVar7;
          piVar7 = piVar7 + 0xc;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      iVar3 = pMVar9->h;
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (((pMVar9->dims == 2) && (pMVar9->w == iVar13)) &&
         ((pMVar9->h == iVar3 && (pMVar9->elemsize == _elemsize)))) {
        if (pMVar9->data != (void *)0x0) {
          sVar12 = pMVar9->cstep;
LAB_0010a6db:
          if ((long)pMVar9->c * sVar12 != 0) {
            if (0 < iVar3) {
              iVar13 = 0;
              pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                pMVar16 = pMVar8;
                if (pMVar11 != pMVar8) {
                  pvVar17 = (void *)((long)pMVar9->w * (long)iVar13 * 4 + (long)pMVar9->data);
                  lVar15 = 0x1c;
                  uVar18 = 0;
                  do {
                    lVar14 = (long)*(int *)((long)&pMVar16->data + lVar15);
                    memcpy(pvVar17,(void *)(lVar14 * iVar13 * 4 +
                                           *(long *)((long)pMVar16 + lVar15 + -0x1c)),
                           lVar14 * _elemsize);
                    pvVar17 = (void *)((long)pvVar17 +
                                      (long)*(int *)((long)&pMVar16->data + lVar15) * 4);
                    uVar18 = uVar18 + 1;
                    pMVar16 = (bottom_blobs->
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar8 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                    lVar15 = lVar15 + 0x30;
                  } while (uVar18 < (ulong)(((long)pMVar8 - (long)pMVar16 >> 4) *
                                           -0x5555555555555555));
                }
                iVar13 = iVar13 + 1;
                pMVar11 = pMVar8;
                pMVar8 = pMVar16;
              } while (iVar13 != iVar3);
              return 0;
            }
            goto LAB_0010aca4;
          }
        }
      }
      else {
        piVar7 = pMVar9->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if ((*piVar7 == 0) && (pMVar9->data != (void *)0x0)) {
            free(*(void **)((long)pMVar9->data + -8));
          }
        }
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        pMVar9->elemsize = _elemsize;
        pMVar9->dims = 2;
        pMVar9->w = iVar13;
        pMVar9->h = iVar3;
        pMVar9->c = 1;
        sVar12 = (size_t)(iVar13 * iVar3);
        pMVar9->cstep = sVar12;
        if (iVar13 * iVar3 != 0) {
          lVar15 = _elemsize * sVar12;
          pvVar17 = malloc(lVar15 + 0x1c);
          pvVar6 = (void *)((long)pvVar17 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 - 8) = pvVar17;
          pMVar9->data = pvVar6;
          pMVar9->refcount = (int *)((long)pvVar6 + lVar15);
          *(undefined4 *)((long)pvVar6 + lVar15) = 1;
          goto LAB_0010a6db;
        }
      }
      goto LAB_0010ab74;
    }
    uVar10 = uVar10 ^ 3;
    if (uVar10 == 0 && uVar5 == 0) {
      uVar1 = pMVar9->w;
      uVar2 = pMVar9->h;
      lVar15 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar15 == 0) {
        iVar13 = 0;
      }
      else {
        lVar15 = (lVar15 >> 4) * -0x5555555555555555;
        lVar15 = lVar15 + (ulong)(lVar15 == 0);
        piVar7 = &pMVar9->c;
        iVar13 = 0;
        do {
          iVar13 = iVar13 + *piVar7;
          piVar7 = piVar7 + 0xc;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar20._0_4_ = -(uint)(pMVar9->dims == 3);
      auVar20._4_4_ = -(uint)(uVar1 == pMVar9->w);
      auVar20._8_4_ = -(uint)(uVar2 == pMVar9->h);
      auVar20._12_4_ = -(uint)(iVar13 == pMVar9->c);
      iVar3 = movmskps(3,auVar20);
      if ((iVar3 == 0xf) && (pMVar9->elemsize == _elemsize)) {
        if (pMVar9->data != (void *)0x0) {
          uVar18 = pMVar9->cstep;
LAB_0010a90e:
          if ((long)iVar13 * uVar18 != 0) {
            pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar8) {
              lVar15 = 0x28;
              iVar13 = 0;
              uVar18 = 0;
              do {
                iVar3 = *(int *)((long)pMVar8 + lVar15 + -4);
                memcpy((void *)(pMVar9->cstep * (long)iVar13 * pMVar9->elemsize + (long)pMVar9->data
                               ),*(void **)((long)pMVar8 + lVar15 + -0x28),
                       (long)(*(int *)((long)&pMVar8->data + lVar15) * iVar3) * _elemsize);
                iVar13 = iVar13 + iVar3;
                uVar18 = uVar18 + 1;
                pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar15 = lVar15 + 0x30;
              } while (uVar18 < (ulong)(((long)(bottom_blobs->
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar8 >> 4) * -0x5555555555555555));
            }
            goto LAB_0010aca4;
          }
        }
      }
      else {
        piVar7 = pMVar9->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if ((*piVar7 == 0) && (pMVar9->data != (void *)0x0)) {
            free(*(void **)((long)pMVar9->data + -8));
          }
        }
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        pMVar9->elemsize = _elemsize;
        pMVar9->dims = 3;
        pMVar9->w = uVar1;
        pMVar9->h = uVar2;
        pMVar9->c = iVar13;
        uVar18 = ((long)(int)(uVar2 * uVar1) * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
        pMVar9->cstep = uVar18;
        if ((long)iVar13 * uVar18 != 0) {
          lVar15 = (long)iVar13 * uVar18 * _elemsize;
          pvVar17 = malloc(lVar15 + 0x1c);
          pvVar6 = (void *)((long)pvVar17 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 - 8) = pvVar17;
          pMVar9->data = pvVar6;
          pMVar9->refcount = (int *)((long)pvVar6 + lVar15);
          *(undefined4 *)((long)pvVar6 + lVar15) = 1;
          iVar13 = pMVar9->c;
          goto LAB_0010a90e;
        }
      }
      goto LAB_0010ab74;
    }
    if ((uVar5 ^ 1) == 0 && uVar10 == 0) {
      iVar13 = pMVar9->w;
      uVar10 = pMVar9->c;
      lVar15 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar15 == 0) {
        iVar3 = 0;
      }
      else {
        lVar15 = (lVar15 >> 4) * -0x5555555555555555;
        lVar15 = lVar15 + (ulong)(lVar15 == 0);
        piVar7 = &pMVar9->h;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *piVar7;
          piVar7 = piVar7 + 0xc;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar21._0_4_ = -(uint)(pMVar9->dims == 3);
      auVar21._4_4_ = -(uint)(iVar13 == pMVar9->w);
      auVar21._8_4_ = -(uint)(iVar3 == pMVar9->h);
      auVar21._12_4_ = -(uint)(uVar10 == pMVar9->c);
      iVar4 = movmskps(3,auVar21);
      if ((iVar4 == 0xf) && (pMVar9->elemsize == _elemsize)) {
        if (pMVar9->data != (void *)0x0) {
          uVar18 = pMVar9->cstep;
          uVar5 = uVar10;
LAB_0010aaae:
          if ((long)(int)uVar5 * uVar18 != 0) {
            if (0 < (int)uVar10) {
              uVar18 = 0;
              pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
              pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              do {
                pMVar16 = pMVar8;
                if (pMVar11 != pMVar8) {
                  pvVar17 = (void *)(pMVar9->cstep * uVar18 * pMVar9->elemsize + (long)pMVar9->data)
                  ;
                  lVar15 = 0x28;
                  uVar19 = 0;
                  do {
                    lVar14 = (long)*(int *)((long)pMVar16 + lVar15 + -8) *
                             (long)*(int *)((long)pMVar16 + lVar15 + -0xc);
                    memcpy(pvVar17,(void *)(*(long *)((long)&pMVar16->data + lVar15) * uVar18 *
                                            *(long *)((long)pMVar16 + lVar15 + -0x18) +
                                           *(long *)((long)pMVar16 + lVar15 + -0x28)),
                           _elemsize * lVar14);
                    pvVar17 = (void *)((long)pvVar17 + lVar14 * 4);
                    uVar19 = uVar19 + 1;
                    pMVar16 = (bottom_blobs->
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                              super__Vector_impl_data._M_start;
                    pMVar8 = (bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                    lVar15 = lVar15 + 0x30;
                  } while (uVar19 < (ulong)(((long)pMVar8 - (long)pMVar16 >> 4) *
                                           -0x5555555555555555));
                }
                uVar18 = uVar18 + 1;
                pMVar11 = pMVar8;
                pMVar8 = pMVar16;
              } while (uVar18 != uVar10);
              return 0;
            }
            goto LAB_0010aca4;
          }
        }
      }
      else {
        piVar7 = pMVar9->refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if ((*piVar7 == 0) && (pMVar9->data != (void *)0x0)) {
            free(*(void **)((long)pMVar9->data + -8));
          }
        }
        pMVar9->data = (void *)0x0;
        pMVar9->refcount = (int *)0x0;
        pMVar9->elemsize = _elemsize;
        pMVar9->dims = 3;
        pMVar9->w = iVar13;
        pMVar9->h = iVar3;
        pMVar9->c = uVar10;
        uVar18 = ((long)(iVar3 * iVar13) * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
        pMVar9->cstep = uVar18;
        if ((long)(int)uVar10 * uVar18 != 0) {
          lVar15 = (long)(int)uVar10 * uVar18 * _elemsize;
          pvVar17 = malloc(lVar15 + 0x1c);
          pvVar6 = (void *)((long)pvVar17 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar6 - 8) = pvVar17;
          pMVar9->data = pvVar6;
          pMVar9->refcount = (int *)((long)pvVar6 + lVar15);
          *(undefined4 *)((long)pvVar6 + lVar15) = 1;
          uVar5 = pMVar9->c;
          goto LAB_0010aaae;
        }
      }
      goto LAB_0010ab74;
    }
    if (uVar10 == 0 && uVar5 == 2) {
      iVar13 = pMVar9->h;
      uVar10 = pMVar9->c;
      lVar15 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar15 == 0) {
        iVar3 = 0;
      }
      else {
        lVar15 = (lVar15 >> 4) * -0x5555555555555555;
        lVar15 = lVar15 + (ulong)(lVar15 == 0);
        piVar7 = &pMVar9->w;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *piVar7;
          piVar7 = piVar7 + 0xc;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_00,iVar3,iVar13,uVar10,_elemsize);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar10) {
        uVar18 = 0;
        do {
          if (0 < iVar13) {
            pvVar17 = (void *)(this_00->cstep * uVar18 * this_00->elemsize + (long)this_00->data);
            iVar3 = 0;
            pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              pMVar11 = pMVar9;
              if (pMVar8 != pMVar9) {
                lVar15 = 0x28;
                uVar19 = 0;
                do {
                  lVar14 = (long)*(int *)((long)pMVar11 + lVar15 + -0xc);
                  memcpy(pvVar17,(void *)(*(long *)((long)&pMVar11->data + lVar15) * uVar18 *
                                          *(long *)((long)pMVar11 + lVar15 + -0x18) +
                                          *(long *)((long)pMVar11 + lVar15 + -0x28) +
                                         lVar14 * iVar3 * 4),_elemsize * lVar14);
                  pvVar17 = (void *)((long)pvVar17 +
                                    (long)*(int *)((long)pMVar11 + lVar15 + -0xc) * 4);
                  uVar19 = uVar19 + 1;
                  pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_finish;
                  lVar15 = lVar15 + 0x30;
                } while (uVar19 < (ulong)(((long)pMVar9 - (long)pMVar11 >> 4) * -0x5555555555555555)
                        );
              }
              iVar3 = iVar3 + 1;
              pMVar8 = pMVar9;
              pMVar9 = pMVar11;
            } while (iVar3 != iVar13);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar10);
        return 0;
      }
    }
LAB_0010aca4:
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int i=0; i<h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            int size = bottom_blob.cstep * channels;

            const float* ptr = bottom_blob;
            float* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w;
                }
            }
        }

        return 0;
    }

    return 0;
}